

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_operator.cpp
# Opt level: O0

void __thiscall
duckdb::ExpressionExecutor::Execute
          (ExpressionExecutor *this,BoundOperatorExpression *expr,ExpressionState *state,
          SelectionVector *sel,idx_t count,Vector *result)

{
  ulong uVar1;
  bool bVar2;
  ExpressionType EVar3;
  size_type sVar4;
  undefined8 uVar5;
  ExpressionExecutor *this_00;
  ExpressionState *state_00;
  NotImplementedException *this_01;
  SelectionVector *in_RCX;
  BaseExpression *in_RSI;
  ulong in_R8;
  value_type *child_2;
  ExceptionType error_type_1;
  ErrorData error_1;
  exception *ex_1;
  Value val;
  idx_t i_2;
  DataChunk intermediate_1;
  SelectionVector selvec;
  ExceptionType error_type;
  ErrorData error;
  exception *ex;
  ExpressionState *child_state;
  idx_t i_1;
  idx_t idx;
  idx_t base_idx;
  idx_t i;
  idx_t result_count;
  UnifiedVectorFormat vdata;
  Vector vector_to_check_1;
  idx_t child_1;
  idx_t next_count;
  idx_t remaining_count;
  SelectionVector *current_sel;
  SelectionVector *next_sel;
  SelectionVector result_sel;
  SelectionVector slice_sel;
  SelectionVector sel_b;
  SelectionVector sel_a;
  Vector new_result;
  Vector comp_res;
  Vector vector_to_check;
  idx_t child;
  Value false_val;
  Vector intermediate;
  Vector left;
  ExpressionType expression_type;
  Vector *in_stack_fffffffffffff6a8;
  Vector *in_stack_fffffffffffff6b0;
  Vector *in_stack_fffffffffffff6b8;
  allocator *paVar6;
  Vector *in_stack_fffffffffffff6c0;
  idx_t in_stack_fffffffffffff6c8;
  LogicalType *in_stack_fffffffffffff6d0;
  idx_t in_stack_fffffffffffff6d8;
  VectorType vector_type_p;
  undefined6 in_stack_fffffffffffff6e0;
  undefined1 in_stack_fffffffffffff6e6;
  undefined1 in_stack_fffffffffffff6e7;
  undefined7 in_stack_fffffffffffff6e8;
  undefined1 in_stack_fffffffffffff6ef;
  Vector *in_stack_fffffffffffff6f0;
  Vector *in_stack_fffffffffffff6f8;
  undefined7 in_stack_fffffffffffff700;
  undefined1 in_stack_fffffffffffff707;
  idx_t in_stack_fffffffffffff708;
  Vector *in_stack_fffffffffffff710;
  UnifiedVectorFormat *in_stack_fffffffffffff770;
  Vector *in_stack_fffffffffffff778;
  Vector *in_stack_fffffffffffff780;
  SelectionVector *in_stack_fffffffffffff788;
  ExpressionState *in_stack_fffffffffffff790;
  Expression *in_stack_fffffffffffff798;
  Expression *expr_00;
  Vector *in_stack_fffffffffffff7a0;
  Vector *in_stack_fffffffffffff7a8;
  ExpressionExecutor *in_stack_fffffffffffff7b0;
  SelectionVector *local_848;
  Value *in_stack_fffffffffffff828;
  Vector *in_stack_fffffffffffff830;
  allocator local_779;
  string local_778 [38];
  undefined1 local_752;
  allocator local_751;
  string local_750 [16];
  idx_t in_stack_fffffffffffff8c0;
  SelectionVector *in_stack_fffffffffffff8c8;
  Vector *in_stack_fffffffffffff8d0;
  ulong local_4b8;
  int local_4ac;
  ulong local_498;
  long local_490;
  SelectionVector *local_488;
  ulong local_3c0;
  ulong local_3b8;
  ulong local_3b0;
  SelectionVector *local_3a8;
  SelectionVector *local_3a0;
  SelectionVector local_368;
  SelectionVector local_350 [17];
  ulong local_1b8;
  undefined1 local_6d;
  allocator local_59;
  string local_58 [39];
  ExpressionType local_31;
  ulong local_28;
  SelectionVector *local_20;
  BaseExpression *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_31 = BaseExpression::GetExpressionType(in_RSI);
  if ((local_31 == COMPARE_IN) || (local_31 == COMPARE_NOT_IN)) {
    sVar4 = ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ::size((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    *)local_10[1].alias.field_2._M_local_buf);
    if (sVar4 < 2) {
      local_6d = 1;
      uVar5 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_58,"IN needs at least two children",&local_59);
      InvalidInputException::InvalidInputException
                ((InvalidInputException *)in_stack_fffffffffffff6b0,
                 (string *)in_stack_fffffffffffff6a8);
      local_6d = 0;
      __cxa_throw(uVar5,&InvalidInputException::typeinfo,
                  InvalidInputException::~InvalidInputException);
    }
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_stack_fffffffffffff6b0,(size_type)in_stack_fffffffffffff6a8);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffff6b0);
    LogicalType::LogicalType
              ((LogicalType *)in_stack_fffffffffffff6b0,(LogicalType *)in_stack_fffffffffffff6a8);
    Vector::Vector(in_stack_fffffffffffff6f0,
                   (LogicalType *)CONCAT17(in_stack_fffffffffffff6ef,in_stack_fffffffffffff6e8),
                   CONCAT17(in_stack_fffffffffffff6e7,
                            CONCAT16(in_stack_fffffffffffff6e6,in_stack_fffffffffffff6e0)));
    LogicalType::~LogicalType((LogicalType *)0x633a4e);
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_stack_fffffffffffff6b0,(size_type)in_stack_fffffffffffff6a8);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffff6b0);
    vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
                  *)in_stack_fffffffffffff6b0,(size_type)in_stack_fffffffffffff6a8);
    ::std::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>::get
              ((unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_> *
               )in_stack_fffffffffffff6b0);
    Execute((ExpressionExecutor *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798,
            in_stack_fffffffffffff790,in_stack_fffffffffffff788,(idx_t)in_stack_fffffffffffff780,
            in_stack_fffffffffffff778);
    LogicalType::LogicalType
              (in_stack_fffffffffffff6d0,(LogicalTypeId)(in_stack_fffffffffffff6c8 >> 0x38));
    Vector::Vector(in_stack_fffffffffffff6f0,
                   (LogicalType *)CONCAT17(in_stack_fffffffffffff6ef,in_stack_fffffffffffff6e8),
                   CONCAT17(in_stack_fffffffffffff6e7,
                            CONCAT16(in_stack_fffffffffffff6e6,in_stack_fffffffffffff6e0)));
    LogicalType::~LogicalType((LogicalType *)0x633b1f);
    Value::BOOLEAN((bool)in_stack_fffffffffffff6ef);
    Vector::Reference(in_stack_fffffffffffff830,in_stack_fffffffffffff828);
    for (local_1b8 = 1; uVar1 = local_1b8,
        sVar4 = ::std::
                vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ::size((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        *)local_10[1].alias.field_2._M_local_buf), uVar1 < sVar4;
        local_1b8 = local_1b8 + 1) {
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)in_stack_fffffffffffff6b0,(size_type)in_stack_fffffffffffff6a8);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffff6b0);
      LogicalType::LogicalType
                ((LogicalType *)in_stack_fffffffffffff6b0,(LogicalType *)in_stack_fffffffffffff6a8);
      Vector::Vector(in_stack_fffffffffffff6f0,
                     (LogicalType *)CONCAT17(in_stack_fffffffffffff6ef,in_stack_fffffffffffff6e8),
                     CONCAT17(in_stack_fffffffffffff6e7,
                              CONCAT16(in_stack_fffffffffffff6e6,in_stack_fffffffffffff6e0)));
      LogicalType::~LogicalType((LogicalType *)0x633c06);
      LogicalType::LogicalType
                (in_stack_fffffffffffff6d0,(LogicalTypeId)(in_stack_fffffffffffff6c8 >> 0x38));
      Vector::Vector(in_stack_fffffffffffff6f0,
                     (LogicalType *)CONCAT17(in_stack_fffffffffffff6ef,in_stack_fffffffffffff6e8),
                     CONCAT17(in_stack_fffffffffffff6e7,
                              CONCAT16(in_stack_fffffffffffff6e6,in_stack_fffffffffffff6e0)));
      LogicalType::~LogicalType((LogicalType *)0x633c43);
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)in_stack_fffffffffffff6b0,(size_type)in_stack_fffffffffffff6a8);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffff6b0);
      vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
                    *)in_stack_fffffffffffff6b0,(size_type)in_stack_fffffffffffff6a8);
      ::std::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>::get
                ((unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
                  *)in_stack_fffffffffffff6b0);
      Execute((ExpressionExecutor *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798,
              in_stack_fffffffffffff790,in_stack_fffffffffffff788,(idx_t)in_stack_fffffffffffff780,
              in_stack_fffffffffffff778);
      VectorOperations::Equals
                (in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0,
                 (idx_t)in_stack_fffffffffffff6a8);
      if (local_1b8 == 1) {
        Vector::Reference((Vector *)CONCAT17(in_stack_fffffffffffff707,in_stack_fffffffffffff700),
                          in_stack_fffffffffffff6f8);
      }
      else {
        LogicalType::LogicalType
                  (in_stack_fffffffffffff6d0,(LogicalTypeId)(in_stack_fffffffffffff6c8 >> 0x38));
        Vector::Vector(in_stack_fffffffffffff6f0,
                       (LogicalType *)CONCAT17(in_stack_fffffffffffff6ef,in_stack_fffffffffffff6e8),
                       (bool)in_stack_fffffffffffff6e7,(bool)in_stack_fffffffffffff6e6,
                       in_stack_fffffffffffff6d8);
        LogicalType::~LogicalType((LogicalType *)0x633e8b);
        VectorOperations::Or
                  (in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0,
                   (idx_t)in_stack_fffffffffffff6a8);
        Vector::Reference((Vector *)CONCAT17(in_stack_fffffffffffff707,in_stack_fffffffffffff700),
                          in_stack_fffffffffffff6f8);
        Vector::~Vector(in_stack_fffffffffffff6b0);
      }
      Vector::~Vector(in_stack_fffffffffffff6b0);
      Vector::~Vector(in_stack_fffffffffffff6b0);
    }
    if (local_31 == COMPARE_NOT_IN) {
      VectorOperations::Not(in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8,0x633f94);
    }
    else {
      Vector::Reference((Vector *)CONCAT17(in_stack_fffffffffffff707,in_stack_fffffffffffff700),
                        in_stack_fffffffffffff6f8);
    }
    Value::~Value((Value *)in_stack_fffffffffffff6b0);
    Vector::~Vector(in_stack_fffffffffffff6b0);
    Vector::~Vector(in_stack_fffffffffffff6b0);
  }
  else if (local_31 == OPERATOR_COALESCE) {
    SelectionVector::SelectionVector
              ((SelectionVector *)in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
    SelectionVector::SelectionVector
              ((SelectionVector *)in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
    SelectionVector::SelectionVector
              ((SelectionVector *)in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
    SelectionVector::SelectionVector
              ((SelectionVector *)in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
    local_3a0 = local_350;
    local_3a8 = local_20;
    local_3b0 = local_28;
    for (local_3c0 = 0;
        sVar4 = ::std::
                vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ::size((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        *)local_10[1].alias.field_2._M_local_buf), local_3c0 < sVar4;
        local_3c0 = local_3c0 + 1) {
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)in_stack_fffffffffffff6b0,(size_type)in_stack_fffffffffffff6a8);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffff6b0);
      LogicalType::LogicalType
                ((LogicalType *)in_stack_fffffffffffff6b0,(LogicalType *)in_stack_fffffffffffff6a8);
      Vector::Vector(in_stack_fffffffffffff6f0,
                     (LogicalType *)CONCAT17(in_stack_fffffffffffff6ef,in_stack_fffffffffffff6e8),
                     CONCAT17(in_stack_fffffffffffff6e7,
                              CONCAT16(in_stack_fffffffffffff6e6,in_stack_fffffffffffff6e0)));
      LogicalType::~LogicalType((LogicalType *)0x634160);
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)in_stack_fffffffffffff6b0,(size_type)in_stack_fffffffffffff6a8);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffff6b0);
      vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
                    *)in_stack_fffffffffffff6b0,(size_type)in_stack_fffffffffffff6a8);
      ::std::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>::get
                ((unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
                  *)in_stack_fffffffffffff6b0);
      Execute((ExpressionExecutor *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798,
              in_stack_fffffffffffff790,in_stack_fffffffffffff788,(idx_t)in_stack_fffffffffffff780,
              in_stack_fffffffffffff778);
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffff6c0);
      Vector::ToUnifiedFormat
                (in_stack_fffffffffffff780,(idx_t)in_stack_fffffffffffff778,
                 in_stack_fffffffffffff770);
      local_490 = 0;
      local_3b8 = 0;
      for (local_498 = 0; local_498 < local_3b0; local_498 = local_498 + 1) {
        if (local_3a8 != (SelectionVector *)0x0) {
          SelectionVector::get_index(local_3a8,local_498);
        }
        SelectionVector::get_index(local_488,local_498);
        bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          ((TemplatedValidityMask<unsigned_long> *)in_stack_fffffffffffff6b8,
                           (idx_t)in_stack_fffffffffffff6b0);
        if (bVar2) {
          SelectionVector::set_index
                    ((SelectionVector *)in_stack_fffffffffffff6c0,(idx_t)in_stack_fffffffffffff6b8,
                     (idx_t)in_stack_fffffffffffff6b0);
          local_490 = local_490 + 1;
          SelectionVector::set_index
                    ((SelectionVector *)in_stack_fffffffffffff6c0,(idx_t)in_stack_fffffffffffff6b8,
                     (idx_t)in_stack_fffffffffffff6b0);
        }
        else {
          local_3b8 = local_3b8 + 1;
          SelectionVector::set_index
                    ((SelectionVector *)in_stack_fffffffffffff6c0,(idx_t)in_stack_fffffffffffff6b8,
                     (idx_t)in_stack_fffffffffffff6b0);
        }
      }
      if (local_490 != 0) {
        Vector::Slice(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0)
        ;
        NumericCast<unsigned_int,unsigned_long,void>(0x6344c8);
        FillSwitch(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                   (SelectionVector *)in_stack_fffffffffffff798,
                   (sel_t)((ulong)in_stack_fffffffffffff790 >> 0x20));
      }
      local_3a8 = local_3a0;
      if (local_3a0 == local_350) {
        local_848 = &local_368;
      }
      else {
        local_848 = local_350;
      }
      local_3a0 = local_848;
      local_3b0 = local_3b8;
      if (local_3b8 == 0) {
        local_4ac = 5;
      }
      else {
        local_4ac = 0;
      }
      UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffff6b0);
      Vector::~Vector(in_stack_fffffffffffff6b0);
      if (local_4ac != 0) break;
    }
    vector_type_p = (VectorType)(in_stack_fffffffffffff6d8 >> 0x38);
    if (local_3b0 != 0) {
      for (local_4b8 = 0; vector_type_p = (VectorType)(in_stack_fffffffffffff6d8 >> 0x38),
          local_4b8 < local_3b0; local_4b8 = local_4b8 + 1) {
        SelectionVector::get_index(local_3a8,local_4b8);
        FlatVector::SetNull(in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                            (bool)in_stack_fffffffffffff707);
      }
    }
    if (local_20 == (SelectionVector *)0x0) {
      if (local_28 == 1) {
        Vector::SetVectorType
                  ((Vector *)
                   CONCAT17(in_stack_fffffffffffff6e7,
                            CONCAT16(in_stack_fffffffffffff6e6,in_stack_fffffffffffff6e0)),
                   vector_type_p);
      }
    }
    else {
      Vector::Slice(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0);
    }
    SelectionVector::~SelectionVector((SelectionVector *)0x6346cf);
    SelectionVector::~SelectionVector((SelectionVector *)0x6346dc);
    SelectionVector::~SelectionVector((SelectionVector *)0x6346e9);
    SelectionVector::~SelectionVector((SelectionVector *)0x6346f6);
  }
  else if (local_31 == OPERATOR_TRY) {
    expr_00 = (Expression *)0x0;
    vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
                  *)in_stack_fffffffffffff6b0,(size_type)in_stack_fffffffffffff6a8);
    unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>::
    operator*((unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>
               *)in_stack_fffffffffffff6b0);
    this_00 = (ExpressionExecutor *)
              vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                            *)in_stack_fffffffffffff6b0,(size_type)in_stack_fffffffffffff6a8);
    state_00 = (ExpressionState *)
               unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)in_stack_fffffffffffff6b0);
    Execute(this_00,expr_00,state_00,in_stack_fffffffffffff788,(idx_t)in_stack_fffffffffffff780,
            in_stack_fffffffffffff778);
  }
  else {
    sVar4 = ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ::size((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    *)local_10[1].alias.field_2._M_local_buf);
    if (sVar4 != 1) {
      this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      paVar6 = &local_779;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_778,"operator",paVar6);
      NotImplementedException::NotImplementedException(this_01,(string *)in_stack_fffffffffffff6a8);
      __cxa_throw(this_01,&NotImplementedException::typeinfo,
                  NotImplementedException::~NotImplementedException);
    }
    DataChunk::Reset((DataChunk *)in_stack_fffffffffffff710);
    vector<duckdb::Vector,_true>::operator[]
              ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffff6b0,
               (size_type)in_stack_fffffffffffff6a8);
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_stack_fffffffffffff6b0,(size_type)in_stack_fffffffffffff6a8);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffff6b0);
    vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
                  *)in_stack_fffffffffffff6b0,(size_type)in_stack_fffffffffffff6a8);
    ::std::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>::get
              ((unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_> *
               )in_stack_fffffffffffff6b0);
    Execute((ExpressionExecutor *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798,
            in_stack_fffffffffffff790,in_stack_fffffffffffff788,(idx_t)in_stack_fffffffffffff780,
            in_stack_fffffffffffff778);
    EVar3 = BaseExpression::GetExpressionType(local_10);
    if (EVar3 == OPERATOR_NOT) {
      VectorOperations::Not(in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8,0x635018);
    }
    else if (EVar3 == OPERATOR_IS_NULL) {
      VectorOperations::IsNull(in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8,0x63503a);
    }
    else {
      if (EVar3 != OPERATOR_IS_NOT_NULL) {
        local_752 = 1;
        uVar5 = __cxa_allocate_exception(0x10);
        paVar6 = &local_751;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_750,"Unsupported operator type with 1 child!",paVar6);
        NotImplementedException::NotImplementedException
                  ((NotImplementedException *)in_stack_fffffffffffff6b0,
                   (string *)in_stack_fffffffffffff6a8);
        local_752 = 0;
        __cxa_throw(uVar5,&NotImplementedException::typeinfo,
                    NotImplementedException::~NotImplementedException);
      }
      VectorOperations::IsNotNull(in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8,0x63505c);
    }
  }
  return;
}

Assistant:

void ExpressionExecutor::Execute(const BoundOperatorExpression &expr, ExpressionState *state,
                                 const SelectionVector *sel, idx_t count, Vector &result) {
	// special handling for special snowflake 'IN'
	// IN has n children
	auto expression_type = expr.GetExpressionType();
	if (expression_type == ExpressionType::COMPARE_IN || expression_type == ExpressionType::COMPARE_NOT_IN) {
		if (expr.children.size() < 2) {
			throw InvalidInputException("IN needs at least two children");
		}

		Vector left(expr.children[0]->return_type);
		// eval left side
		Execute(*expr.children[0], state->child_states[0].get(), sel, count, left);

		// init result to false
		Vector intermediate(LogicalType::BOOLEAN);
		Value false_val = Value::BOOLEAN(false);
		intermediate.Reference(false_val);

		// in rhs is a list of constants
		// for every child, OR the result of the comparison with the left
		// to get the overall result.
		for (idx_t child = 1; child < expr.children.size(); child++) {
			Vector vector_to_check(expr.children[child]->return_type);
			Vector comp_res(LogicalType::BOOLEAN);

			Execute(*expr.children[child], state->child_states[child].get(), sel, count, vector_to_check);
			VectorOperations::Equals(left, vector_to_check, comp_res, count);

			if (child == 1) {
				// first child: move to result
				intermediate.Reference(comp_res);
			} else {
				// otherwise OR together
				Vector new_result(LogicalType::BOOLEAN, true, false);
				VectorOperations::Or(intermediate, comp_res, new_result, count);
				intermediate.Reference(new_result);
			}
		}
		if (expression_type == ExpressionType::COMPARE_NOT_IN) {
			// NOT IN: invert result
			VectorOperations::Not(intermediate, result, count);
		} else {
			// directly use the result
			result.Reference(intermediate);
		}
	} else if (expression_type == ExpressionType::OPERATOR_COALESCE) {
		SelectionVector sel_a(count);
		SelectionVector sel_b(count);
		SelectionVector slice_sel(count);
		SelectionVector result_sel(count);
		SelectionVector *next_sel = &sel_a;
		const SelectionVector *current_sel = sel;
		idx_t remaining_count = count;
		idx_t next_count;
		for (idx_t child = 0; child < expr.children.size(); child++) {
			Vector vector_to_check(expr.children[child]->return_type);
			Execute(*expr.children[child], state->child_states[child].get(), current_sel, remaining_count,
			        vector_to_check);

			UnifiedVectorFormat vdata;
			vector_to_check.ToUnifiedFormat(remaining_count, vdata);

			idx_t result_count = 0;
			next_count = 0;
			for (idx_t i = 0; i < remaining_count; i++) {
				auto base_idx = current_sel ? current_sel->get_index(i) : i;
				auto idx = vdata.sel->get_index(i);
				if (vdata.validity.RowIsValid(idx)) {
					slice_sel.set_index(result_count, i);
					result_sel.set_index(result_count++, base_idx);
				} else {
					next_sel->set_index(next_count++, base_idx);
				}
			}
			if (result_count > 0) {
				vector_to_check.Slice(slice_sel, result_count);
				FillSwitch(vector_to_check, result, result_sel, NumericCast<sel_t>(result_count));
			}
			current_sel = next_sel;
			next_sel = next_sel == &sel_a ? &sel_b : &sel_a;
			remaining_count = next_count;
			if (next_count == 0) {
				break;
			}
		}
		if (remaining_count > 0) {
			for (idx_t i = 0; i < remaining_count; i++) {
				FlatVector::SetNull(result, current_sel->get_index(i), true);
			}
		}
		if (sel) {
			result.Slice(*sel, count);
		} else if (count == 1) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
		}
	} else if (expression_type == ExpressionType::OPERATOR_TRY) {
		auto &child_state = *state->child_states[0];
		try {
			Execute(*expr.children[0], &child_state, sel, count, result);
			return;
		} catch (std::exception &ex) {
			ErrorData error(ex);
			auto error_type = error.Type();
			if (!Exception::IsExecutionError(error_type)) {
				throw;
			}
		}
		SelectionVector selvec(1);
		DataChunk intermediate;
		intermediate.Initialize(GetAllocator(), {result.GetType()}, 1);
		for (idx_t i = 0; i < count; i++) {
			intermediate.Reset();
			intermediate.SetCardinality(1);
			selvec.set_index(0, sel ? sel->get_index(i) : i);
			Value val(result.GetType());
			try {
				Execute(*expr.children[0], &child_state, &selvec, 1, intermediate.data[0]);
				val = intermediate.GetValue(0, 0);
			} catch (std::exception &ex) {
				ErrorData error(ex);
				auto error_type = error.Type();
				if (!Exception::IsExecutionError(error_type)) {
					throw;
				}
			}
			result.SetValue(i, val);
		}
		if (count == 1) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
		}
	} else if (expr.children.size() == 1) {
		state->intermediate_chunk.Reset();
		auto &child = state->intermediate_chunk.data[0];

		Execute(*expr.children[0], state->child_states[0].get(), sel, count, child);
		switch (expr.GetExpressionType()) {
		case ExpressionType::OPERATOR_NOT: {
			VectorOperations::Not(child, result, count);
			break;
		}
		case ExpressionType::OPERATOR_IS_NULL: {
			VectorOperations::IsNull(child, result, count);
			break;
		}
		case ExpressionType::OPERATOR_IS_NOT_NULL: {
			VectorOperations::IsNotNull(child, result, count);
			break;
		}
		default:
			throw NotImplementedException("Unsupported operator type with 1 child!");
		}
	} else {
		throw NotImplementedException("operator");
	}
}